

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O3

FillRule __thiscall lunasvg::parseFillRule(lunasvg *this,string_view *input)

{
  int iVar1;
  size_type __rlen;
  long lVar2;
  
  lVar2 = 0x10;
  while ((*(lunasvg **)(&UNK_001599d8 + lVar2) != this ||
         ((this != (lunasvg *)0x0 &&
          (iVar1 = bcmp(input,*(void **)(&parseFillRule::entries[0].first + lVar2),(size_t)this),
          iVar1 != 0))))) {
    lVar2 = lVar2 + 0x18;
    if (lVar2 == 0x40) {
      return NonZero;
    }
  }
  return (&UNK_001599d0)[lVar2];
}

Assistant:

static FillRule parseFillRule(const std::string_view& input)
{
    static const SVGEnumerationEntry<FillRule> entries[] = {
        {FillRule::NonZero, "nonzero"},
        {FillRule::EvenOdd, "evenodd"}
    };

    return parseEnumValue(input, entries, FillRule::NonZero);
}